

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

int tchecker::lexical_cmp(clock_constraint_t *c1,clock_constraint_t *c2)

{
  clock_id_t cVar1;
  clock_id_t cVar2;
  ineq_cmp_t iVar3;
  ineq_cmp_t iVar4;
  integer_t iVar5;
  integer_t iVar6;
  undefined4 local_3c;
  clock_constraint_t *c2_local;
  clock_constraint_t *c1_local;
  
  cVar1 = clock_constraint_t::id1(c1);
  cVar2 = clock_constraint_t::id1(c2);
  if (cVar1 == cVar2) {
    cVar1 = clock_constraint_t::id2(c1);
    cVar2 = clock_constraint_t::id2(c2);
    if (cVar1 == cVar2) {
      iVar3 = clock_constraint_t::comparator(c1);
      iVar4 = clock_constraint_t::comparator(c2);
      if (iVar3 == iVar4) {
        iVar5 = clock_constraint_t::value(c1);
        iVar6 = clock_constraint_t::value(c2);
        if (iVar5 == iVar6) {
          local_3c = 0;
        }
        else {
          iVar5 = clock_constraint_t::value(c1);
          iVar6 = clock_constraint_t::value(c2);
          local_3c = 1;
          if (iVar5 < iVar6) {
            local_3c = -1;
          }
        }
        c1_local._4_4_ = local_3c;
      }
      else {
        iVar3 = clock_constraint_t::comparator(c1);
        c1_local._4_4_ = 1;
        if (iVar3 == LT) {
          c1_local._4_4_ = -1;
        }
      }
    }
    else {
      cVar1 = clock_constraint_t::id2(c1);
      cVar2 = clock_constraint_t::id2(c2);
      c1_local._4_4_ = 1;
      if (cVar1 < cVar2) {
        c1_local._4_4_ = -1;
      }
    }
  }
  else {
    cVar1 = clock_constraint_t::id1(c1);
    cVar2 = clock_constraint_t::id2(c2);
    c1_local._4_4_ = 1;
    if (cVar1 < cVar2) {
      c1_local._4_4_ = -1;
    }
  }
  return c1_local._4_4_;
}

Assistant:

int lexical_cmp(tchecker::clock_constraint_t const & c1, tchecker::clock_constraint_t const & c2)
{
  if (c1.id1() != c2.id1())
    return (c1.id1() < c2.id2() ? -1 : 1);
  if (c1.id2() != c2.id2())
    return (c1.id2() < c2.id2() ? -1 : 1);
  if (c1.comparator() != c2.comparator())
    return (c1.comparator() == tchecker::LT ? -1 : 1);
  return (c1.value() == c2.value() ? 0 : (c1.value() < c2.value() ? -1 : 1));
}